

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_user_geometry.h
# Opt level: O3

PrimInfo * __thiscall
embree::sse2::UserGeometryISA::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,UserGeometryISA *this,PrimRef *prims,BBox1f *time_range,
          range<unsigned_long> *r,size_t k,uint geomID)

{
  int iVar1;
  float fVar2;
  undefined4 uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  float fVar7;
  BBox1f BVar8;
  undefined1 extraout_var [12];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar21;
  float fVar22;
  undefined1 auVar18 [16];
  float fVar23;
  undefined1 auVar19 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar20;
  float fVar27;
  float fVar28;
  undefined1 auVar24 [16];
  float fVar29;
  undefined1 auVar25 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar26;
  BBox<embree::Vec3fa> bupper1;
  BBox3fa box;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  size_t local_1c0;
  undefined8 local_1b8;
  float fStack_1b0;
  float fStack_1ac;
  undefined8 local_1a8;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  size_t local_180;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [8];
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  PrimInfo *local_e0;
  range<unsigned_long> *local_d8;
  PrimRef *local_d0;
  undefined8 local_c8;
  float fStack_c0;
  float fStack_bc;
  undefined8 local_b8;
  float fStack_b0;
  float fStack_ac;
  undefined8 local_a8;
  float fStack_a0;
  float fStack_9c;
  undefined8 local_98;
  float fStack_90;
  float fStack_8c;
  undefined8 local_88;
  float fStack_80;
  float fStack_7c;
  undefined8 local_78;
  float fStack_70;
  float fStack_6c;
  void *local_60;
  float local_58;
  int local_54;
  undefined8 *local_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
       = 0x7f8000007f800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
           field_0 + 8) = 0x7f8000007f800000;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
       = 0xff800000ff800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
           field_0 + 8) = 0xff800000ff800000;
  local_148._8_8_ = 0x7f8000007f800000;
  local_148._0_8_ = 0x7f8000007f800000;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = 0x7f8000007f800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
           field_0 + 8) = 0x7f8000007f800000;
  local_158._8_8_ = 0xff800000ff800000;
  local_158._0_8_ = 0xff800000ff800000;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = 0xff800000ff800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
           field_0 + 8) = 0xff800000ff800000;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  local_d0 = prims;
  BVar8 = Geometry::getTimeRange((Geometry *)this);
  fVar2 = time_range->lower;
  if (time_range->lower <= BVar8.lower) {
    fVar2 = BVar8.lower;
  }
  fStack_44 = BVar8.upper;
  local_48 = fStack_44;
  if (time_range->upper <= fStack_44) {
    local_48 = time_range->upper;
  }
  if (fVar2 <= local_48) {
    uVar6 = r->_begin;
    local_e0 = __return_storage_ptr__;
    if (uVar6 < r->_end) {
      local_1c0 = 0;
      local_178._8_8_ = 0x7f8000007f800000;
      local_178._0_8_ = 0x7f8000007f800000;
      local_148._8_8_ = 0x7f8000007f800000;
      local_148._0_8_ = 0x7f8000007f800000;
      local_168._8_8_ = 0xff800000ff800000;
      local_168._0_8_ = 0xff800000ff800000;
      local_158._8_8_ = 0xff800000ff800000;
      local_158._0_8_ = 0xff800000ff800000;
      local_180 = k;
      local_d8 = r;
      fStack_40 = fStack_44;
      fStack_3c = fStack_44;
      do {
        BVar8 = (this->super_UserGeometry).super_AccelSet.super_Geometry.time_range;
        auVar19._12_4_ = BVar8.lower;
        fVar17 = (this->super_UserGeometry).super_AccelSet.super_Geometry.fnumTimeSegments;
        fVar11 = BVar8.upper - auVar19._12_4_;
        auVar25._0_4_ = local_48 - auVar19._12_4_;
        fVar7 = floorf(((fVar2 - auVar19._12_4_) / fVar11) * 1.0000002 * fVar17);
        auVar19._12_4_ = 0.0;
        if (0.0 <= fVar7) {
          auVar19._12_4_ = fVar7;
        }
        fVar7 = ceilf((auVar25._0_4_ / fVar11) * 0.99999976 * fVar17);
        if (fVar17 <= fVar7) {
          fVar7 = fVar17;
        }
        fVar11 = (float)uVar6;
        if ((uint)(int)auVar19._12_4_ <= (uint)(int)fVar7) {
          uVar5 = (ulong)(int)auVar19._12_4_;
          do {
            local_1b8 = (this->super_UserGeometry).super_AccelSet.super_Geometry.userPtr;
            fStack_1ac = (float)uVar5;
            fStack_1b0 = fVar11;
            local_1a8 = &local_108;
            uVar3 = (**(code **)&(this->super_UserGeometry).super_AccelSet.super_Geometry.field_0x58
                    )(&local_1b8);
            auVar13._0_4_ =
                 -(uint)((local_f8 < 1.844e+18 && -1.844e+18 < local_108) && local_108 <= local_f8);
            auVar13._4_4_ =
                 -(uint)((-1.844e+18 < fStack_104 && fStack_f4 < 1.844e+18) &&
                        fStack_104 <= fStack_f4);
            auVar13._8_4_ =
                 -(uint)((-1.844e+18 < fStack_100 && fStack_f0 < 1.844e+18) &&
                        fStack_100 <= fStack_f0);
            auVar13._12_4_ =
                 -(uint)((-1.844e+18 < fStack_fc && fStack_ec < 1.844e+18) && fStack_fc <= fStack_ec
                        );
            uVar3 = movmskps(uVar3,auVar13);
            if ((~(byte)uVar3 & 7) != 0) goto LAB_00949f20;
            uVar5 = uVar5 + 1;
          } while (uVar5 <= (ulong)(long)(int)fVar7);
          fVar17 = (this->super_UserGeometry).super_AccelSet.super_Geometry.fnumTimeSegments;
          BVar8 = (this->super_UserGeometry).super_AccelSet.super_Geometry.time_range;
        }
        auVar19._12_4_ = BVar8.lower;
        fVar7 = BVar8.upper - auVar19._12_4_;
        fVar15 = (fVar2 - auVar19._12_4_) / fVar7;
        fVar7 = (local_48 - auVar19._12_4_) / fVar7;
        local_198 = fVar17 * fVar7;
        auVar25._0_4_ = floorf(fVar17 * fVar15);
        auVar25._4_4_ = ceilf(local_198);
        auVar19._12_4_ = auVar25._0_4_;
        if (auVar25._0_4_ <= 0.0) {
          auVar19._12_4_ = 0.0;
        }
        auVar25._8_4_ = auVar25._4_4_;
        if (fVar17 <= auVar25._4_4_) {
          auVar25._8_4_ = fVar17;
        }
        register0x00001204 = extraout_var;
        local_138._0_4_ = auVar25._8_4_;
        fStack_1ac = (float)(int)auVar19._12_4_;
        iVar4 = (int)auVar25._0_4_;
        if ((int)auVar25._0_4_ < 0) {
          iVar4 = -1;
        }
        iVar1 = (int)fVar17 + 1;
        if ((int)auVar25._4_4_ < (int)fVar17 + 1) {
          iVar1 = (int)auVar25._4_4_;
        }
        local_1b8 = (this->super_UserGeometry).super_AccelSet.super_Geometry.userPtr;
        local_1a8 = &local_108;
        fStack_1b0 = fVar11;
        local_128 = fStack_1ac;
        (**(code **)&(this->super_UserGeometry).super_AccelSet.super_Geometry.field_0x58)
                  (&local_1b8);
        local_88 = (this->super_UserGeometry).super_AccelSet.super_Geometry.userPtr;
        local_118 = (float)(int)auVar25._8_4_;
        fStack_80 = fVar11;
        fStack_7c = (float)(int)auVar25._8_4_;
        local_78 = &local_1b8;
        (**(code **)&(this->super_UserGeometry).super_AccelSet.super_Geometry.field_0x58)(&local_88)
        ;
        auVar19._12_4_ = fVar17 * fVar15 - auVar19._12_4_;
        if (iVar1 - iVar4 == 1) {
          if (auVar19._12_4_ <= 0.0) {
            auVar19._12_4_ = 0.0;
          }
          fVar17 = 1.0 - auVar19._12_4_;
          auVar24._0_4_ = fVar17 * local_108 + auVar19._12_4_ * (float)local_1b8;
          auVar24._4_4_ = fVar17 * fStack_104 + auVar19._12_4_ * local_1b8._4_4_;
          auVar24._8_4_ = fVar17 * fStack_100 + auVar19._12_4_ * fStack_1b0;
          auVar24._12_4_ = fVar17 * fStack_fc + auVar19._12_4_ * fStack_1ac;
          auVar18._0_4_ = fVar17 * local_f8 + auVar19._12_4_ * (float)local_1a8;
          auVar18._4_4_ = fVar17 * fStack_f4 + auVar19._12_4_ * local_1a8._4_4_;
          auVar18._8_4_ = fVar17 * fStack_f0 + auVar19._12_4_ * fStack_1a0;
          auVar18._12_4_ = fVar17 * fStack_ec + auVar19._12_4_ * fStack_19c;
          fVar17 = (float)local_138._0_4_ - local_198;
          if (fVar17 <= 0.0) {
            fVar17 = 0.0;
          }
          auVar19._12_4_ = 1.0 - fVar17;
          auVar25._0_4_ = (float)local_1b8 * auVar19._12_4_ + local_108 * fVar17;
          auVar25._4_4_ = local_1b8._4_4_ * auVar19._12_4_ + fStack_104 * fVar17;
          auVar25._8_4_ = fStack_1b0 * auVar19._12_4_ + fStack_100 * fVar17;
          auVar25._12_4_ = fStack_1ac * auVar19._12_4_ + fStack_fc * fVar17;
          auVar19._0_4_ = auVar19._12_4_ * (float)local_1a8 + fVar17 * local_f8;
          auVar19._4_4_ = auVar19._12_4_ * local_1a8._4_4_ + fVar17 * fStack_f4;
          auVar19._8_4_ = auVar19._12_4_ * fStack_1a0 + fVar17 * fStack_f0;
          auVar19._12_4_ = auVar19._12_4_ * fStack_19c + fVar17 * fStack_ec;
        }
        else {
          fStack_9c = (float)((int)local_128 + 1);
          local_a8 = (this->super_UserGeometry).super_AccelSet.super_Geometry.userPtr;
          fStack_a0 = fVar11;
          local_98 = &local_88;
          (**(code **)&(this->super_UserGeometry).super_AccelSet.super_Geometry.field_0x58)
                    (&local_a8);
          fStack_bc = (float)((int)local_118 + -1);
          local_c8 = (this->super_UserGeometry).super_AccelSet.super_Geometry.userPtr;
          fStack_c0 = fVar11;
          local_b8 = &local_a8;
          (**(code **)&(this->super_UserGeometry).super_AccelSet.super_Geometry.field_0x58)
                    (&local_c8);
          if (auVar19._12_4_ <= 0.0) {
            auVar19._12_4_ = 0.0;
          }
          auVar25._0_4_ = 1.0 - auVar19._12_4_;
          auVar24._0_4_ = local_108 * auVar25._0_4_ + (float)local_88 * auVar19._12_4_;
          auVar24._4_4_ = fStack_104 * auVar25._0_4_ + local_88._4_4_ * auVar19._12_4_;
          auVar24._8_4_ = fStack_100 * auVar25._0_4_ + fStack_80 * auVar19._12_4_;
          auVar24._12_4_ = fStack_fc * auVar25._0_4_ + fStack_7c * auVar19._12_4_;
          auVar18._0_4_ = auVar25._0_4_ * local_f8 + auVar19._12_4_ * (float)local_78;
          auVar18._4_4_ = auVar25._0_4_ * fStack_f4 + auVar19._12_4_ * local_78._4_4_;
          auVar18._8_4_ = auVar25._0_4_ * fStack_f0 + auVar19._12_4_ * fStack_70;
          auVar18._12_4_ = auVar25._0_4_ * fStack_ec + auVar19._12_4_ * fStack_6c;
          auVar19._12_4_ = (float)local_138._0_4_ - local_198;
          if (auVar19._12_4_ <= 0.0) {
            auVar19._12_4_ = 0.0;
          }
          fVar16 = 1.0 - auVar19._12_4_;
          auVar25._0_4_ = (float)local_1b8 * fVar16 + (float)local_a8 * auVar19._12_4_;
          auVar25._4_4_ = local_1b8._4_4_ * fVar16 + local_a8._4_4_ * auVar19._12_4_;
          auVar25._8_4_ = fStack_1b0 * fVar16 + fStack_a0 * auVar19._12_4_;
          auVar25._12_4_ = fStack_1ac * fVar16 + fStack_9c * auVar19._12_4_;
          auVar19._0_4_ = fVar16 * (float)local_1a8 + auVar19._12_4_ * (float)local_98;
          auVar19._4_4_ = fVar16 * local_1a8._4_4_ + auVar19._12_4_ * local_98._4_4_;
          auVar19._8_4_ = fVar16 * fStack_1a0 + auVar19._12_4_ * fStack_90;
          auVar19._12_4_ = fVar16 * fStack_19c + auVar19._12_4_ * fStack_8c;
          iVar4 = iVar4 + 1;
          if (iVar4 < iVar1) {
            do {
              local_138._4_4_ = auVar19._4_4_;
              local_138._0_4_ = auVar19._0_4_;
              fStack_130 = auVar19._8_4_;
              fStack_12c = auVar19._12_4_;
              fVar16 = ((float)iVar4 / fVar17 - fVar15) / (fVar7 - fVar15);
              fVar14 = 1.0 - fVar16;
              fVar27 = auVar24._4_4_;
              fVar28 = auVar24._8_4_;
              fVar29 = auVar24._12_4_;
              local_198 = auVar24._0_4_ * fVar14 + auVar25._0_4_ * fVar16;
              fStack_194 = fVar27 * fVar14 + auVar25._4_4_ * fVar16;
              fStack_190 = fVar28 * fVar14 + auVar25._8_4_ * fVar16;
              fStack_18c = fVar29 * fVar14 + auVar25._12_4_ * fVar16;
              fVar21 = auVar18._4_4_;
              fVar22 = auVar18._8_4_;
              fVar23 = auVar18._12_4_;
              local_118 = fVar14 * auVar18._0_4_ + fVar16 * auVar19._0_4_;
              fStack_114 = fVar14 * fVar21 + fVar16 * auVar19._4_4_;
              fStack_110 = fVar14 * fVar22 + fVar16 * auVar19._8_4_;
              fStack_10c = fVar14 * fVar23 + fVar16 * auVar19._12_4_;
              local_60 = (this->super_UserGeometry).super_AccelSet.super_Geometry.userPtr;
              local_128 = auVar25._0_4_;
              fStack_124 = auVar25._4_4_;
              fStack_120 = auVar25._8_4_;
              fStack_11c = auVar25._12_4_;
              local_58 = fVar11;
              local_54 = iVar4;
              local_50 = &local_c8;
              (**(code **)&(this->super_UserGeometry).super_AccelSet.super_Geometry.field_0x58)
                        (&local_60);
              auVar9._0_4_ = (float)local_c8 - local_198;
              auVar9._4_4_ = local_c8._4_4_ - fStack_194;
              auVar9._8_4_ = fStack_c0 - fStack_190;
              auVar9._12_4_ = fStack_bc - fStack_18c;
              auVar12._0_4_ = (float)local_b8 - local_118;
              auVar12._4_4_ = local_b8._4_4_ - fStack_114;
              auVar12._8_4_ = fStack_b0 - fStack_110;
              auVar12._12_4_ = fStack_ac - fStack_10c;
              auVar19 = minps(auVar9,ZEXT816(0));
              auVar13 = maxps(auVar12,ZEXT816(0));
              auVar24._0_4_ = auVar24._0_4_ + auVar19._0_4_;
              auVar24._4_4_ = fVar27 + auVar19._4_4_;
              auVar24._8_4_ = fVar28 + auVar19._8_4_;
              auVar24._12_4_ = fVar29 + auVar19._12_4_;
              auVar25._0_4_ = auVar19._0_4_ + local_128;
              auVar25._4_4_ = auVar19._4_4_ + fStack_124;
              auVar25._8_4_ = auVar19._8_4_ + fStack_120;
              auVar25._12_4_ = auVar19._12_4_ + fStack_11c;
              auVar18._0_4_ = auVar18._0_4_ + auVar13._0_4_;
              auVar18._4_4_ = fVar21 + auVar13._4_4_;
              auVar18._8_4_ = fVar22 + auVar13._8_4_;
              auVar18._12_4_ = fVar23 + auVar13._12_4_;
              auVar19._0_4_ = auVar13._0_4_ + (float)local_138._0_4_;
              auVar19._4_4_ = auVar13._4_4_ + (float)local_138._4_4_;
              auVar19._8_4_ = auVar13._8_4_ + fStack_130;
              auVar19._12_4_ = auVar13._12_4_ + fStack_12c;
              iVar4 = iVar4 + 1;
            } while (iVar1 != iVar4);
          }
          else {
          }
        }
        auVar19 = maxps(auVar18,auVar19);
        auVar25 = minps(auVar24,auVar25);
        aVar26._0_12_ = auVar25._0_12_;
        aVar26.m128[3] = (float)geomID;
        aVar20._0_12_ = auVar19._0_12_;
        aVar20.m128[3] = fVar11;
        local_178 = minps(local_178,(undefined1  [16])aVar26);
        local_168 = maxps(local_168,(undefined1  [16])aVar20);
        auVar10._0_4_ = auVar25._0_4_ + auVar19._0_4_;
        auVar10._4_4_ = auVar25._4_4_ + auVar19._4_4_;
        auVar10._8_4_ = auVar25._8_4_ + auVar19._8_4_;
        auVar10._12_4_ = (float)geomID + fVar11;
        local_148 = minps(local_148,auVar10);
        local_158 = maxps(local_158,auVar10);
        local_1c0 = local_1c0 + 1;
        local_d0[local_180].lower.field_0 = aVar26;
        local_d0[local_180].upper.field_0 = aVar20;
        r = local_d8;
        local_180 = local_180 + 1;
LAB_00949f20:
        uVar6 = uVar6 + 1;
      } while (uVar6 < r->_end);
    }
    else {
      local_1c0 = 0;
      local_168._8_8_ = 0xff800000ff800000;
      local_168._0_8_ = 0xff800000ff800000;
      local_178._8_8_ = 0x7f8000007f800000;
      local_178._0_8_ = 0x7f8000007f800000;
    }
    *(undefined8 *)
     &(local_e0->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
         local_178._0_8_;
    *(undefined8 *)
     ((long)&(local_e0->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 + 8)
         = local_178._8_8_;
    *(undefined8 *)
     &(local_e0->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
         local_168._0_8_;
    *(undefined8 *)
     ((long)&(local_e0->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 + 8)
         = local_168._8_8_;
    *(undefined8 *)
     &(local_e0->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
         local_148._0_8_;
    *(undefined8 *)
     ((long)&(local_e0->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 + 8)
         = local_148._8_8_;
    *(undefined8 *)
     &(local_e0->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
         local_158._0_8_;
    *(undefined8 *)
     ((long)&(local_e0->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 + 8)
         = local_158._8_8_;
    local_e0->end = local_1c0;
    __return_storage_ptr__ = local_e0;
  }
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArrayMB(PrimRef* prims, const BBox1f& time_range, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        const BBox1f t0t1 = BBox1f::intersect(getTimeRange(), time_range);
        if (t0t1.empty()) return pinfo;
        
        for (size_t j = r.begin(); j < r.end(); j++) {
          LBBox3fa lbounds = empty;
          if (!linearBounds(j, t0t1, lbounds))
            continue;
          const PrimRef prim(lbounds.bounds(), geomID, unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }